

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,ZeroCopyOutputStream *output)

{
  byte bVar1;
  TextGenerator generator;
  
  generator.indent_level_ = this->initial_indent_level_;
  generator.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_005409d8;
  generator.buffer_ = (char *)0x0;
  generator.buffer_size_ = 0;
  generator.at_start_of_line_ = true;
  generator.failed_ = false;
  generator.insert_silent_marker_ = false;
  generator.output_ = output;
  generator.initial_indent_level_ = generator.indent_level_;
  PrintUnknownFields(this,unknown_fields,&generator.super_BaseTextGenerator,10);
  bVar1 = generator.failed_ ^ 1;
  TextGenerator::~TextGenerator(&generator);
  return (bool)bVar1;
}

Assistant:

bool TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields,
    io::ZeroCopyOutputStream* output) const {
  TextGenerator generator(output, initial_indent_level_);

  PrintUnknownFields(unknown_fields, &generator, kUnknownFieldRecursionLimit);

  // Output false if the generator failed internally.
  return !generator.failed();
}